

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t invalid_mbs(void *_p,size_t n,archive_string_conv *sc)

{
  size_t in_RSI;
  char *in_RDI;
  wchar_t wc;
  mbstate_t shift_state;
  size_t r;
  char *p;
  wchar_t local_3c;
  mbstate_t local_38;
  size_t local_30;
  char *local_28;
  size_t local_18;
  
  local_28 = in_RDI;
  local_18 = in_RSI;
  memset(&local_38,0,8);
  while( true ) {
    if (local_18 == 0) {
      return L'\0';
    }
    local_30 = mbrtowc(&local_3c,local_28,local_18,&local_38);
    if ((local_30 == 0xffffffffffffffff) || (local_30 == 0xfffffffffffffffe)) break;
    if (local_30 == 0) {
      return L'\0';
    }
    local_28 = local_28 + local_30;
    local_18 = local_18 - local_30;
  }
  return L'\xffffffff';
}

Assistant:

static int
invalid_mbs(const void *_p, size_t n, struct archive_string_conv *sc)
{
	const char *p = (const char *)_p;
	size_t r;

#if HAVE_MBRTOWC
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#else
	/* Clear the shift state before starting. */
	mbtowc(NULL, NULL, 0);
#endif
	while (n) {
		wchar_t wc;

#if HAVE_MBRTOWC
		r = mbrtowc(&wc, p, n, &shift_state);
#else
		r = mbtowc(&wc, p, n);
#endif
		if (r == (size_t)-1 || r == (size_t)-2)
			return (-1);/* Invalid. */
		if (r == 0)
			break;
		p += r;
		n -= r;
	}
	(void)sc; /* UNUSED */
	return (0); /* All Okey. */
}